

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::Recycler::EnableConcurrent(Recycler *this,ThreadService *threadService,bool startAllThreads)

{
  bool bVar1;
  bool bVar2;
  DWORD DVar3;
  ConfigFlagsTable *pCVar4;
  undefined1 *puVar5;
  HANDLE pVStack_48;
  DWORD ret;
  HANDLE handle [2];
  HANDLE concurrentThreadWin32Handle;
  ThreadHandle concurrentThread;
  bool startedParallelThread2;
  bool startedParallelThread1;
  bool startConcurrentThread;
  bool startAllThreads_local;
  ThreadService *threadService_local;
  Recycler *this_local;
  
  if ((this->disableConcurrent & 1U) == 0) {
    bVar1 = InitializeConcurrent(this,threadService);
    if (bVar1) {
      pCVar4 = GetRecyclerFlagsTable(this);
      bVar1 = Js::Phases::IsEnabled(&pCVar4->Off,ConcurrentMarkPhase);
      this->enableConcurrentMark = (bool)((bVar1 ^ 0xffU) & 1);
      pCVar4 = GetRecyclerFlagsTable(this);
      bVar1 = Js::Phases::IsEnabled(&pCVar4->Off,ParallelMarkPhase);
      this->enableParallelMark = (bool)((bVar1 ^ 0xffU) & 1);
      pCVar4 = GetRecyclerFlagsTable(this);
      bVar1 = Js::Phases::IsEnabled(&pCVar4->Off,ConcurrentSweepPhase);
      this->enableConcurrentSweep = (bool)((bVar1 ^ 0xffU) & 1);
      if (((this->enableParallelMark & 1U) != 0) && (this->maxParallelism == 1)) {
        this->enableParallelMark = false;
      }
      bVar1 = JsUtil::ThreadService::HasCallback(threadService);
      if (bVar1) {
        this->threadService = threadService;
        this_local._7_1_ = true;
      }
      else {
        concurrentThread._6_1_ = true;
        bVar1 = false;
        concurrentThread._4_1_ = false;
        if (((startAllThreads) && ((this->enableParallelMark & 1U) != 0)) &&
           (2 < this->maxParallelism)) {
          bVar2 = RecyclerParallelThread::EnableConcurrent(&this->parallelThread1,true);
          if (bVar2) {
            bVar1 = true;
            if (3 < this->maxParallelism) {
              concurrentThread._4_1_ =
                   RecyclerParallelThread::EnableConcurrent(&this->parallelThread2,true);
              concurrentThread._6_1_ = concurrentThread._4_1_;
            }
          }
          else {
            concurrentThread._6_1_ = false;
          }
        }
        if ((concurrentThread._6_1_ != false) &&
           (puVar5 = (undefined1 *)
                     PlatformAgnostic::Thread::Create
                               (300000,StaticThreadProc,this,ThreadInitStackSizeParamIsAReservation,
                                L"Chakra Background Recycler"), puVar5 != &DAT_ffffffffffffffff)) {
          pVStack_48 = this->concurrentWorkDoneEvent;
          handle[0] = puVar5;
          handle[1] = puVar5;
          DVar3 = WaitForMultipleObjectsEx(2,&stack0xffffffffffffffb8,0,0xffffffff,0);
          if (DVar3 == 0) {
            this->threadService = threadService;
            this->concurrentThread = handle[1];
            return true;
          }
          CloseHandle(handle[1]);
        }
        if ((bVar1) &&
           (RecyclerParallelThread::Shutdown(&this->parallelThread1),
           concurrentThread._4_1_ != false)) {
          RecyclerParallelThread::Shutdown(&this->parallelThread2);
        }
        this->enableConcurrentMark = false;
        this->enableParallelMark = false;
        this->enableConcurrentSweep = false;
        if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
          CloseHandle(this->concurrentWorkReadyEvent);
          this->concurrentWorkReadyEvent = (HANDLE)0x0;
        }
        if (this->concurrentWorkDoneEvent != (HANDLE)0x0) {
          CloseHandle(this->concurrentWorkDoneEvent);
          this->concurrentWorkDoneEvent = (HANDLE)0x0;
        }
        if (this->concurrentIdleDecommitEvent != (HANDLE)0x0) {
          CloseHandle(this->concurrentIdleDecommitEvent);
          this->concurrentIdleDecommitEvent = (HANDLE)0x0;
        }
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::EnableConcurrent(JsUtil::ThreadService *threadService, bool startAllThreads)
{
    if (this->disableConcurrent)
    {
        return false;
    }

    if (!this->InitializeConcurrent(threadService))
    {
        return false;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    this->enableConcurrentMark = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentMarkPhase);
    this->enableParallelMark = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase);
    this->enableConcurrentSweep = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentSweepPhase);
#else
    this->enableConcurrentMark = true;
    this->enableParallelMark = true;
    this->enableConcurrentSweep = true;
#endif

    if (this->enableParallelMark && this->maxParallelism == 1)
    {
        // Disable parallel mark if only 1 CPU
        this->enableParallelMark = false;
    }

    if (threadService->HasCallback())
    {
        this->threadService = threadService;
        return true;
    }
    else
    {
        bool startConcurrentThread = true;
        bool startedParallelThread1 = false;
        bool startedParallelThread2 = false;

        if (startAllThreads)
        {
            if (this->enableParallelMark && this->maxParallelism > 2)
            {
                if (!parallelThread1.EnableConcurrent(true))
                {
                    startConcurrentThread = false;
                }
                else
                {
                    startedParallelThread1 = true;
                    if (this->maxParallelism > 3)
                    {
                        if (!parallelThread2.EnableConcurrent(true))
                        {
                            startConcurrentThread = false;
                        }
                        else
                        {
                            startedParallelThread2 = true;
                        }
                    }
                }
            }
        }

        if (startConcurrentThread)
        {
            auto concurrentThread = PlatformAgnostic::Thread::Create(Recycler::ConcurrentThreadStackSize, 
                &Recycler::StaticThreadProc, this, 
                PlatformAgnostic::Thread::ThreadInitStackSizeParamIsAReservation,
                _u("Chakra Background Recycler"));

            if (concurrentThread != PlatformAgnostic::Thread::InvalidHandle)
            {
                HANDLE concurrentThreadWin32Handle = reinterpret_cast<HANDLE>(concurrentThread);
                // Wait for recycler thread to initialize
                HANDLE handle[2] = { this->concurrentWorkDoneEvent, concurrentThreadWin32Handle };
                DWORD ret = WaitForMultipleObjectsEx(2, handle, FALSE, INFINITE, FALSE);
                if (ret == WAIT_OBJECT_0)
                {
                    this->threadService = threadService;
                    this->concurrentThread = concurrentThreadWin32Handle;
                    return true;
                }

                CloseHandle(concurrentThreadWin32Handle);
            }
        }

        if (startedParallelThread1)
        {
            parallelThread1.Shutdown();
            if (startedParallelThread2)
            {
                parallelThread2.Shutdown();
            }
        }
    }

    // We failed to start a concurrent thread so we set these back to false and clean up
    this->enableConcurrentMark = false;
    this->enableParallelMark = false;
    this->enableConcurrentSweep = false;

    if (concurrentWorkReadyEvent)
    {
        CloseHandle(concurrentWorkReadyEvent);
        concurrentWorkReadyEvent = nullptr;
    }
    if (concurrentWorkDoneEvent)
    {
        CloseHandle(concurrentWorkDoneEvent);
        concurrentWorkDoneEvent = nullptr;
    }
#ifdef IDLE_DECOMMIT_ENABLED
    if (concurrentIdleDecommitEvent)
    {
        CloseHandle(concurrentIdleDecommitEvent);
        concurrentIdleDecommitEvent = nullptr;
    }
#endif

    return false;
}